

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O3

void pffft_zconvolve_accumulate(PFFFT_Setup *s,float *a,float *b,float *ab,float scaling)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  v4sf *vab;
  v4sf *vb;
  v4sf *va;
  long lVar29;
  ulong uVar30;
  
  if ((((uint)ab | (uint)b | (uint)a) & 0xf) != 0) {
    __assert_fail("VALIGNED(a) && VALIGNED(b) && VALIGNED(ab)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                  ,0x6ac,
                  "void pffft_zconvolve_accumulate(PFFFT_Setup *, const float *, const float *, float *, float)"
                 );
  }
  uVar9 = s->Ncvec;
  fVar3 = *a;
  fVar4 = a[4];
  fVar5 = *b;
  fVar6 = b[4];
  fVar7 = *ab;
  fVar8 = ab[4];
  if (0 < (int)uVar9) {
    lVar29 = 0x30;
    uVar30 = 0;
    do {
      pfVar1 = (float *)((long)a + lVar29 + -0x30);
      fVar10 = *pfVar1;
      fVar11 = pfVar1[1];
      fVar12 = pfVar1[2];
      fVar13 = pfVar1[3];
      pfVar1 = (float *)((long)a + lVar29 + -0x20);
      fVar14 = *pfVar1;
      fVar15 = pfVar1[1];
      fVar16 = pfVar1[2];
      fVar17 = pfVar1[3];
      pfVar1 = (float *)((long)b + lVar29 + -0x30);
      fVar18 = *pfVar1;
      fVar19 = pfVar1[1];
      fVar20 = pfVar1[2];
      fVar21 = pfVar1[3];
      pfVar1 = (float *)((long)b + lVar29 + -0x20);
      fVar22 = *pfVar1;
      fVar23 = pfVar1[1];
      fVar24 = pfVar1[2];
      fVar25 = pfVar1[3];
      pfVar1 = (float *)((long)ab + lVar29 + -0x30);
      fVar26 = pfVar1[1];
      fVar27 = pfVar1[2];
      fVar28 = pfVar1[3];
      pfVar2 = (float *)((long)ab + lVar29 + -0x30);
      *pfVar2 = (fVar10 * fVar18 - fVar22 * fVar14) * scaling + *pfVar1;
      pfVar2[1] = (fVar11 * fVar19 - fVar23 * fVar15) * scaling + fVar26;
      pfVar2[2] = (fVar12 * fVar20 - fVar24 * fVar16) * scaling + fVar27;
      pfVar2[3] = (fVar13 * fVar21 - fVar25 * fVar17) * scaling + fVar28;
      pfVar1 = (float *)((long)ab + lVar29 + -0x20);
      fVar26 = pfVar1[1];
      fVar27 = pfVar1[2];
      fVar28 = pfVar1[3];
      pfVar2 = (float *)((long)ab + lVar29 + -0x20);
      *pfVar2 = (fVar14 * fVar18 + fVar10 * fVar22) * scaling + *pfVar1;
      pfVar2[1] = (fVar15 * fVar19 + fVar11 * fVar23) * scaling + fVar26;
      pfVar2[2] = (fVar16 * fVar20 + fVar12 * fVar24) * scaling + fVar27;
      pfVar2[3] = (fVar17 * fVar21 + fVar13 * fVar25) * scaling + fVar28;
      pfVar1 = (float *)((long)a + lVar29 + -0x10);
      fVar10 = *pfVar1;
      fVar11 = pfVar1[1];
      fVar12 = pfVar1[2];
      fVar13 = pfVar1[3];
      pfVar1 = (float *)((long)a + lVar29);
      fVar14 = *pfVar1;
      fVar15 = pfVar1[1];
      fVar16 = pfVar1[2];
      fVar17 = pfVar1[3];
      pfVar1 = (float *)((long)b + lVar29 + -0x10);
      fVar18 = *pfVar1;
      fVar19 = pfVar1[1];
      fVar20 = pfVar1[2];
      fVar21 = pfVar1[3];
      pfVar1 = (float *)((long)b + lVar29);
      fVar22 = *pfVar1;
      fVar23 = pfVar1[1];
      fVar24 = pfVar1[2];
      fVar25 = pfVar1[3];
      pfVar1 = (float *)((long)ab + lVar29 + -0x10);
      fVar26 = pfVar1[1];
      fVar27 = pfVar1[2];
      fVar28 = pfVar1[3];
      pfVar2 = (float *)((long)ab + lVar29 + -0x10);
      *pfVar2 = (fVar10 * fVar18 - fVar22 * fVar14) * scaling + *pfVar1;
      pfVar2[1] = (fVar11 * fVar19 - fVar23 * fVar15) * scaling + fVar26;
      pfVar2[2] = (fVar12 * fVar20 - fVar24 * fVar16) * scaling + fVar27;
      pfVar2[3] = (fVar13 * fVar21 - fVar25 * fVar17) * scaling + fVar28;
      pfVar1 = (float *)((long)ab + lVar29);
      fVar26 = pfVar1[1];
      fVar27 = pfVar1[2];
      fVar28 = pfVar1[3];
      pfVar2 = (float *)((long)ab + lVar29);
      *pfVar2 = (fVar14 * fVar18 + fVar10 * fVar22) * scaling + *pfVar1;
      pfVar2[1] = (fVar15 * fVar19 + fVar11 * fVar23) * scaling + fVar26;
      pfVar2[2] = (fVar16 * fVar20 + fVar12 * fVar24) * scaling + fVar27;
      pfVar2[3] = (fVar17 * fVar21 + fVar13 * fVar25) * scaling + fVar28;
      uVar30 = uVar30 + 2;
      lVar29 = lVar29 + 0x40;
    } while (uVar30 < uVar9);
  }
  if (s->transform != PFFFT_REAL) {
    return;
  }
  *ab = fVar3 * fVar5 * scaling + fVar7;
  ab[4] = fVar4 * fVar6 * scaling + fVar8;
  return;
}

Assistant:

void pffft_zconvolve_accumulate(PFFFT_Setup *s, const float *a, const float *b, float *ab, float scaling) {
  int Ncvec = s->Ncvec;
  const v4sf * RESTRICT va = (const v4sf*)a;
  const v4sf * RESTRICT vb = (const v4sf*)b;
  v4sf * RESTRICT vab = (v4sf*)ab;

#ifdef __arm__
  __builtin_prefetch(va);
  __builtin_prefetch(vb);
  __builtin_prefetch(vab);
  __builtin_prefetch(va+2);
  __builtin_prefetch(vb+2);
  __builtin_prefetch(vab+2);
  __builtin_prefetch(va+4);
  __builtin_prefetch(vb+4);
  __builtin_prefetch(vab+4);
  __builtin_prefetch(va+6);
  __builtin_prefetch(vb+6);
  __builtin_prefetch(vab+6);
# ifndef __clang__
#   define ZCONVOLVE_USING_INLINE_NEON_ASM
# endif
#endif

  float ar, ai, br, bi, abr, abi;
#ifndef ZCONVOLVE_USING_INLINE_ASM
  v4sf vscal = LD_PS1(scaling);
  int i;
#endif

  assert(VALIGNED(a) && VALIGNED(b) && VALIGNED(ab));
  ar = ((v4sf_union*)va)[0].f[0];
  ai = ((v4sf_union*)va)[1].f[0];
  br = ((v4sf_union*)vb)[0].f[0];
  bi = ((v4sf_union*)vb)[1].f[0];
  abr = ((v4sf_union*)vab)[0].f[0];
  abi = ((v4sf_union*)vab)[1].f[0];
 
#ifdef ZCONVOLVE_USING_INLINE_ASM // inline asm version, unfortunately miscompiled by clang 3.2, at least on ubuntu.. so this will be restricted to gcc
  const float *a_ = a, *b_ = b; float *ab_ = ab;
  int N = Ncvec;
  asm volatile("mov         r8, %2                  \n"
               "vdup.f32    q15, %4                 \n"
               "1:                                  \n"
               "pld         [%0,#64]                \n"
               "pld         [%1,#64]                \n"
               "pld         [%2,#64]                \n"
               "pld         [%0,#96]                \n"
               "pld         [%1,#96]                \n"
               "pld         [%2,#96]                \n"
               "vld1.f32    {q0,q1},   [%0,:128]!         \n"
               "vld1.f32    {q4,q5},   [%1,:128]!         \n"
               "vld1.f32    {q2,q3},   [%0,:128]!         \n"
               "vld1.f32    {q6,q7},   [%1,:128]!         \n"
               "vld1.f32    {q8,q9},   [r8,:128]!          \n"
               
               "vmul.f32    q10, q0, q4             \n"
               "vmul.f32    q11, q0, q5             \n"
               "vmul.f32    q12, q2, q6             \n" 
               "vmul.f32    q13, q2, q7             \n"                 
               "vmls.f32    q10, q1, q5             \n"
               "vmla.f32    q11, q1, q4             \n"
               "vld1.f32    {q0,q1}, [r8,:128]!     \n"
               "vmls.f32    q12, q3, q7             \n"
               "vmla.f32    q13, q3, q6             \n"
               "vmla.f32    q8, q10, q15            \n"
               "vmla.f32    q9, q11, q15            \n"
               "vmla.f32    q0, q12, q15            \n"
               "vmla.f32    q1, q13, q15            \n"
               "vst1.f32    {q8,q9},[%2,:128]!    \n"
               "vst1.f32    {q0,q1},[%2,:128]!    \n"
               "subs        %3, #2                  \n"
               "bne         1b                      \n"
               : "+r"(a_), "+r"(b_), "+r"(ab_), "+r"(N) : "r"(scaling) : "r8", "q0","q1","q2","q3","q4","q5","q6","q7","q8","q9", "q10","q11","q12","q13","q15","memory");
#else // default routine, works fine for non-arm cpus with current compilers
  for (i=0; i < Ncvec; i += 2) {
    v4sf ar, ai, br, bi;
    ar = va[2*i+0]; ai = va[2*i+1];
    br = vb[2*i+0]; bi = vb[2*i+1];
    VCPLXMUL(ar, ai, br, bi);
    vab[2*i+0] = VMADD(ar, vscal, vab[2*i+0]);
    vab[2*i+1] = VMADD(ai, vscal, vab[2*i+1]);
    ar = va[2*i+2]; ai = va[2*i+3];
    br = vb[2*i+2]; bi = vb[2*i+3];
    VCPLXMUL(ar, ai, br, bi);
    vab[2*i+2] = VMADD(ar, vscal, vab[2*i+2]);
    vab[2*i+3] = VMADD(ai, vscal, vab[2*i+3]);
  }
#endif
  if (s->transform == PFFFT_REAL) {
    ((v4sf_union*)vab)[0].f[0] = abr + ar*br*scaling;
    ((v4sf_union*)vab)[1].f[0] = abi + ai*bi*scaling;
  }
}